

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

ByteCodeLabel __thiscall Js::ByteCodeWriter::DefineLabel(ByteCodeWriter *this)

{
  int iVar1;
  uint local_c;
  
  if ((this->m_labelOffsets->
      super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count != 0x7fffffff
     ) {
    local_c = 0xffffffff;
    iVar1 = JsUtil::
            List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(this->m_labelOffsets,&local_c);
    return iVar1;
  }
  Throw::OutOfMemory();
}

Assistant:

ByteCodeLabel ByteCodeWriter::DefineLabel()
    {
#if defined(TARGET_64)
        if (m_labelOffsets->Count() == INT_MAX)
        {
            // Reach our limit
            Js::Throw::OutOfMemory();
        }
#else
        // 32-bit machine don't have enough address space to get to INT_MAX
        Assert(m_labelOffsets->Count() < INT_MAX);
#endif

        //
        // Allocate a new label:
        // - All label locations start as "undefined: -1".  Once the label's location is marked in
        //   the byte-code, this will be updated.
        //

        return (ByteCodeLabel)m_labelOffsets->Add(UINT_MAX);
    }